

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# landb.cpp
# Opt level: O0

void * __thiscall lan::db::operator[](db *this,string *context)

{
  void *pvVar1;
  db_bits *pdVar2;
  string local_38;
  string *local_18;
  string *context_local;
  db *this_local;
  
  local_18 = context;
  context_local = (string *)this;
  std::__cxx11::string::string((string *)&local_38,(string *)context);
  pdVar2 = find_rec(this,&local_38,Container,this->first);
  pvVar1 = pdVar2->data;
  std::__cxx11::string::~string((string *)&local_38);
  return pvVar1;
}

Assistant:

void * db::operator[](std::string const context){
            return find_rec(context, lan::Container, first)->data;
        }